

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_value * VmExtractMemObj(jx9_vm *pVm,SyString *pName,int bDup,int bCreate)

{
  uint local_68 [2];
  VmSlot sLocal;
  char *zName;
  sxi32 rc;
  sxu32 nIdx;
  jx9_value *pObj;
  VmFrame *pFrame;
  SyHashEntry *pEntry;
  int local_28;
  int bNullify;
  int bCreate_local;
  int bDup_local;
  SyString *pName_local;
  jx9_vm *pVm_local;
  
  pEntry._4_4_ = 0;
  pObj = (jx9_value *)pVm->pFrame;
  if ((pName == (SyString *)0x0) || (bNullify = bDup, _bCreate_local = pName, pName->nByte == 0)) {
    _bCreate_local = &VmExtractMemObj::sAnnon;
    pEntry._4_4_ = 1;
    bNullify = 0;
  }
  local_28 = bCreate;
  pName_local = (SyString *)pVm;
  pFrame = (VmFrame *)SyHashGet(&pVm->hSuper,_bCreate_local->zString,_bCreate_local->nByte);
  if (pFrame == (VmFrame *)0x0) {
    pFrame = (VmFrame *)
             SyHashGet((SyHash *)(pObj + 1),_bCreate_local->zString,_bCreate_local->nByte);
    if (pFrame == (VmFrame *)0x0) {
      sLocal.pUserData = _bCreate_local->zString;
      if (local_28 == 0) {
        return (jx9_value *)0x0;
      }
      _rc = jx9VmReserveMemObj((jx9_vm *)pName_local,(sxu32 *)((long)&zName + 4));
      if (_rc == (jx9_value *)0x0) {
        return (jx9_value *)0x0;
      }
      if ((bNullify != 0) &&
         (sLocal.pUserData =
               SyMemBackendStrDup((SyMemBackend *)pName_local,_bCreate_local->zString,
                                  _bCreate_local->nByte), (char *)sLocal.pUserData == (char *)0x0))
      {
        return (jx9_value *)0x0;
      }
      zName._0_4_ = SyHashInsert((SyHash *)(pObj + 1),sLocal.pUserData,_bCreate_local->nByte,
                                 (void *)(ulong)zName._4_4_);
      if ((sxi32)zName != 0) {
        local_68[0] = zName._4_4_;
        sLocal.nIdx = 0;
        sLocal._4_4_ = 0;
        SySetPut((SySet *)&pName_local[0x25].nByte,local_68);
        return (jx9_value *)0x0;
      }
      if ((pObj->x).iVal != 0) {
        local_68[0] = zName._4_4_;
        SySetPut((SySet *)&pObj->pVm,local_68);
      }
    }
    else {
      zName._4_4_ = (sxu32)(pFrame->sLocal).pAllocator;
      _rc = (jx9_value *)SySetAt((SySet *)(pName_local + 0x20),zName._4_4_);
      if ((pEntry._4_4_ != 0) && (_rc != (jx9_value *)0x0)) {
        jx9MemObjRelease(_rc);
      }
    }
  }
  else {
    zName._4_4_ = (sxu32)(pFrame->sLocal).pAllocator;
    _rc = (jx9_value *)SySetAt((SySet *)(pName_local + 0x20),zName._4_4_);
  }
  return _rc;
}

Assistant:

static jx9_value * VmExtractMemObj(
	jx9_vm *pVm,           /* Target VM */
	const SyString *pName, /* Variable name */
	int bDup,              /* True to duplicate variable name */
	int bCreate            /* True to create the variable if non-existent */
	)
{
	int bNullify = FALSE;
	SyHashEntry *pEntry;
	VmFrame *pFrame;
	jx9_value *pObj;
	sxu32 nIdx;
	sxi32 rc;
	/* Point to the top active frame */
	pFrame = pVm->pFrame;
	/* Perform the lookup */
	if( pName == 0 || pName->nByte < 1 ){
		static const SyString sAnnon = { " " , sizeof(char) };
		pName = &sAnnon;
		/* Always nullify the object */
		bNullify = TRUE;
		bDup = FALSE;
	}
	/* Check the superglobals table first */
	pEntry = SyHashGet(&pVm->hSuper, (const void *)pName->zString, pName->nByte);
	if( pEntry == 0 ){
		/* Query the top active frame */
		pEntry = SyHashGet(&pFrame->hVar, (const void *)pName->zString, pName->nByte);
		if( pEntry == 0 ){
			char *zName = (char *)pName->zString;
			VmSlot sLocal;
			if( !bCreate ){
				/* Do not create the variable, return NULL */
				return 0;
			}
			/* No such variable, automatically create a new one and install
			 * it in the current frame.
			 */
			pObj = jx9VmReserveMemObj(&(*pVm),&nIdx);
			if( pObj == 0 ){
				return 0;
			}
			if( bDup ){
				/* Duplicate name */
				zName = SyMemBackendStrDup(&pVm->sAllocator, pName->zString, pName->nByte);
				if( zName == 0 ){
					return 0;
				}
			}
			/* Link to the top active VM frame */
			rc = SyHashInsert(&pFrame->hVar, zName, pName->nByte, SX_INT_TO_PTR(nIdx));
			if( rc != SXRET_OK ){
				/* Return the slot to the free pool */
				sLocal.nIdx = nIdx;
				sLocal.pUserData = 0;
				SySetPut(&pVm->aFreeObj, (const void *)&sLocal);
				return 0;
			}
			if( pFrame->pParent != 0 ){
				/* Local variable */
				sLocal.nIdx = nIdx;
				SySetPut(&pFrame->sLocal, (const void *)&sLocal);
			}
		}else{
			/* Extract variable contents */
			nIdx = (sxu32)SX_PTR_TO_INT(pEntry->pUserData);
			pObj = (jx9_value *)SySetAt(&pVm->aMemObj, nIdx);
			if( bNullify && pObj ){
				jx9MemObjRelease(pObj);
			}
		}
	}else{
		/* Superglobal */
		nIdx = (sxu32)SX_PTR_TO_INT(pEntry->pUserData);
		pObj = (jx9_value *)SySetAt(&pVm->aMemObj, nIdx);
	}
	return pObj;
}